

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O1

void __thiscall QProgressDialogPrivate::layout(QProgressDialogPrivate *this)

{
  QWidget *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QStyle *pQVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long in_FS_OFFSET;
  ulong local_78;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar7 = QWidget::style(this_00);
  local_78 = 0;
  uVar2 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x50,0,this_00);
  pQVar7 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x4e,0,this_00);
  iVar1 = (((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1) / 10;
  pQVar7 = QWidget::style(this_00);
  iVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x4b,0,this_00);
  if (iVar4 <= iVar1) {
    iVar1 = iVar4;
  }
  iVar4 = (((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1) / 10;
  pQVar7 = QWidget::style(this_00);
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x4d,0,this_00);
  if (iVar5 <= iVar4) {
    iVar4 = iVar5;
  }
  pQVar7 = QWidget::style(this_00);
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,9,0,this_00,0);
  uVar13 = 0;
  if (this->cancel != (QPushButton *)0x0) {
    local_78 = (**(code **)(*(long *)&(this->cancel->super_QAbstractButton).super_QWidget + 0x70))()
    ;
    uVar13 = local_78 >> 0x20;
  }
  uVar8 = (**(code **)(*(long *)&this->bar->super_QWidget + 0x70))();
  uVar8 = uVar8 >> 0x20;
  iVar6 = -iVar3;
  iVar14 = (this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i;
  iVar12 = iVar14 + 1;
  iVar14 = iVar14 + 4;
  if (-1 < iVar12) {
    iVar14 = iVar12;
  }
  iVar15 = -5;
  do {
    uVar16 = (uint)uVar8;
    iVar10 = (int)uVar13;
    iVar9 = iVar10 + uVar2;
    if (this->cancel == (QPushButton *)0x0) {
      iVar9 = 0;
    }
    iVar9 = (iVar6 - (iVar9 + uVar16 + uVar2)) + iVar12;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar14 >> 2 <= iVar9) break;
    uVar2 = (int)uVar2 / 2;
    iVar3 = iVar3 / 2;
    iVar6 = -iVar3;
    iVar10 = iVar10 - uVar2;
    if (iVar10 < 7) {
      iVar10 = 6;
    }
    uVar11 = (ulong)(iVar10 - 2);
    if (this->cancel == (QPushButton *)0x0) {
      uVar11 = uVar13;
    }
    iVar10 = (int)uVar11;
    uVar16 = uVar16 + ~uVar2;
    if ((int)uVar16 < 5) {
      uVar16 = 4;
    }
    uVar8 = (ulong)uVar16;
    iVar15 = iVar15 + 1;
    uVar13 = uVar11;
  } while (iVar15 != 0);
  if ((QWidget *)this->cancel != (QWidget *)0x0) {
    iVar3 = (this_00->data->crect).x1.m_i;
    iVar12 = (this_00->data->crect).x2.m_i;
    iVar14 = (int)local_78;
    if (iVar5 == 0) {
      local_48.x1.m_i = (iVar12 - (iVar3 + iVar4 + iVar14)) + 1;
    }
    else {
      iVar12 = iVar12 - iVar3;
      local_48.x1.m_i =
           ((iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1) -
           ((int)(((uint)(local_78 >> 0x1f) & 1) + iVar14) >> 1);
    }
    iVar3 = ((iVar6 - iVar10) + (this_00->data->crect).y2.m_i) - (this_00->data->crect).y1.m_i;
    local_48.y1.m_i = iVar3 + 1;
    local_48.x2.m_i = local_48.x1.m_i + iVar14 + -1;
    local_48.y2.m_i = iVar3 + iVar10;
    QWidget::setGeometry((QWidget *)this->cancel,&local_48);
  }
  if ((QWidget *)this->label != (QWidget *)0x0) {
    local_48.x2.m_i = (this_00->data->crect).x2.m_i - ((this_00->data->crect).x1.m_i + iVar4);
    local_48.y1.m_i = 0;
    local_48.y2.m_i = iVar9 + -1;
    local_48.x1.m_i = iVar1;
    QWidget::setGeometry((QWidget *)this->label,&local_48);
  }
  local_48.y1.m_i = iVar9 + uVar2;
  local_48.x2.m_i = (this_00->data->crect).x2.m_i - (iVar4 + (this_00->data->crect).x1.m_i);
  local_48.y2.m_i = uVar16 + local_48.y1.m_i + -1;
  local_48.x1.m_i = iVar1;
  QWidget::setGeometry(&this->bar->super_QWidget,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialogPrivate::layout()
{
    Q_Q(QProgressDialog);
    int sp = q->style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing, nullptr, q);
    int mb = q->style()->pixelMetric(QStyle::PM_LayoutBottomMargin, nullptr, q);
    int ml = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutLeftMargin, nullptr, q));
    int mr = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutRightMargin, nullptr, q));
    const bool centered =
        bool(q->style()->styleHint(QStyle::SH_ProgressDialog_CenterCancelButton, nullptr, q));

    int additionalSpacing = 0;
    QSize cs = cancel ? cancel->sizeHint() : QSize(0,0);
    QSize bh = bar->sizeHint();
    int cspc;
    int lh = 0;

    // Find spacing and sizes that fit.  It is important that a progress
    // dialog can be made very small if the user demands it so.
    for (int attempt=5; attempt--;) {
        cspc = cancel ? cs.height() + sp : 0;
        lh = qMax(0, q->height() - mb - bh.height() - sp - cspc);

        if (lh < q->height()/4) {
            // Getting cramped
            sp /= 2;
            mb /= 2;
            if (cancel) {
                cs.setHeight(qMax(4,cs.height()-sp-2));
            }
            bh.setHeight(qMax(4,bh.height()-sp-1));
        } else {
            break;
        }
    }

    if (cancel) {
        cancel->setGeometry(
            centered ? q->width()/2 - cs.width()/2 : q->width() - mr - cs.width(),
            q->height() - mb - cs.height(),
            cs.width(), cs.height());
    }

    if (label)
        label->setGeometry(ml, additionalSpacing, q->width() - ml - mr, lh);
    bar->setGeometry(ml, lh + sp + additionalSpacing, q->width() - ml - mr, bh.height());
}